

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RTIMUMPU9250.cpp
# Opt level: O0

bool __thiscall RTIMUMPU9250::setSampleRate(RTIMUMPU9250 *this,int rate)

{
  undefined1 auVar1 [16];
  int local_1c;
  int sampleDiv;
  int rate_local;
  RTIMUMPU9250 *this_local;
  
  if ((rate < 5) || (32000 < rate)) {
    fprintf(_stderr,"Illegal sample rate %d\n",(ulong)(uint)rate);
    this_local._7_1_ = false;
  }
  else {
    local_1c = rate;
    if ((rate < 32000) && (7999 < rate)) {
      local_1c = 8000;
    }
    if ((local_1c < 8000) && (999 < local_1c)) {
      local_1c = 1000;
    }
    if (local_1c < 1000) {
      (this->super_RTIMU).m_sampleRate = (int)(1000 / (long)(int)(1000 / (long)local_1c));
    }
    else {
      (this->super_RTIMU).m_sampleRate = local_1c;
    }
    auVar1._8_8_ = 0;
    auVar1._0_8_ = (long)(this->super_RTIMU).m_sampleRate;
    (this->super_RTIMU).m_sampleInterval =
         SUB168((ZEXT816(0) << 0x40 | ZEXT816(1000000)) / auVar1,0);
    this_local._7_1_ = true;
  }
  return this_local._7_1_;
}

Assistant:

bool RTIMUMPU9250::setSampleRate(int rate)
{
    if ((rate < MPU9250_SAMPLERATE_MIN) || (rate > MPU9250_SAMPLERATE_MAX)) {
        HAL_ERROR1("Illegal sample rate %d\n", rate);
        return false;
    }

    //  Note: rates interact with the lpf settings

    if ((rate < MPU9250_SAMPLERATE_MAX) && (rate >= 8000))
        rate = 8000;

    if ((rate < 8000) && (rate >= 1000))
        rate = 1000;

    if (rate < 1000) {
        int sampleDiv = (1000 / rate) - 1;
        m_sampleRate = 1000 / (1 + sampleDiv);
    } else {
        m_sampleRate = rate;
    }
    m_sampleInterval = (uint64_t)1000000 / m_sampleRate;
    return true;
}